

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::hufCompress(unsigned_short *raw,int nRaw,char *compressed)

{
  uint i;
  uint i_00;
  int iVar1;
  unsigned_short *out;
  char *in_RDX;
  int in_ESI;
  int data_length;
  int nBits;
  char *dataStart;
  int tableLength;
  char *tableEnd;
  char *tableStart;
  int iM;
  int im;
  vector<long_long,_std::allocator<long_long>_> freq;
  undefined4 in_stack_00000080;
  longlong *in_stack_00000090;
  int in_stack_ffffffffffffff74;
  unsigned_short *puVar2;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar3;
  size_type in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  unsigned_short *hcode;
  unsigned_short local_39 [12];
  char *local_20;
  int local_4;
  
  if (in_ESI == 0) {
    local_4 = 0;
  }
  else {
    puVar2 = local_39;
    local_20 = in_RDX;
    std::allocator<long_long>::allocator((allocator<long_long> *)0x45e164);
    std::vector<long_long,_std::allocator<long_long>_>::vector
              ((vector<long_long,_std::allocator<long_long>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    std::allocator<long_long>::~allocator((allocator<long_long> *)0x45e184);
    countFrequencies((vector<long_long,_std::allocator<long_long>_> *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),puVar2,
                     in_stack_ffffffffffffff74);
    std::vector<long_long,_std::allocator<long_long>_>::data
              ((vector<long_long,_std::allocator<long_long>_> *)0x45e1b9);
    hufBuildEncTable(in_stack_00000090,(int *)raw,(int *)CONCAT44(nRaw,in_stack_00000080));
    out = (unsigned_short *)(local_20 + 0x14);
    hcode = out;
    std::vector<long_long,_std::allocator<long_long>_>::data
              ((vector<long_long,_std::allocator<long_long>_> *)0x45e1ef);
    hufPackEncTable((longlong *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (int)(in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88,
                    (char **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    i = (int)out - (int)hcode;
    puVar2 = out;
    std::vector<long_long,_std::allocator<long_long>_>::data
              ((vector<long_long,_std::allocator<long_long>_> *)0x45e228);
    i_00 = hufEncode((longlong *)hcode,puVar2,i,in_stack_ffffffffffffff90,(char *)out);
    iVar3 = (int)out;
    iVar1 = i_00 + 7;
    if ((int)(i_00 + 7) < 0) {
      iVar1 = i_00 + 0xe;
    }
    iVar1 = iVar1 >> 3;
    writeUInt(local_20,0);
    writeUInt(local_20 + 4,0);
    writeUInt(local_20 + 8,i);
    writeUInt(local_20 + 0xc,i_00);
    writeUInt(local_20 + 0x10,0);
    local_4 = (iVar3 + iVar1) - (int)local_20;
    std::vector<long_long,_std::allocator<long_long>_>::~vector
              ((vector<long_long,_std::allocator<long_long>_> *)CONCAT44(i_00,iVar1));
  }
  return local_4;
}

Assistant:

static int hufCompress(const unsigned short raw[], int nRaw,
                       char compressed[]) {
  if (nRaw == 0) return 0;

  std::vector<long long> freq(HUF_ENCSIZE);

  countFrequencies(freq, raw, nRaw);

  int im = 0;
  int iM = 0;
  hufBuildEncTable(freq.data(), &im, &iM);

  char *tableStart = compressed + 20;
  char *tableEnd = tableStart;
  hufPackEncTable(freq.data(), im, iM, &tableEnd);
  int tableLength = tableEnd - tableStart;

  char *dataStart = tableEnd;
  int nBits = hufEncode(freq.data(), raw, nRaw, iM, dataStart);
  int data_length = (nBits + 7) / 8;

  writeUInt(compressed, im);
  writeUInt(compressed + 4, iM);
  writeUInt(compressed + 8, tableLength);
  writeUInt(compressed + 12, nBits);
  writeUInt(compressed + 16, 0);  // room for future extensions

  return dataStart + data_length - compressed;
}